

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

void __thiscall
ncnn::Crop::resolve_crop_roi
          (Crop *this,Mat *bottom_blob,int *_woffset,int *_hoffset,int *_doffset,int *_coffset,
          int *_outw,int *_outh,int *_outd,int *_outc)

{
  bool bVar1;
  int *piVar2;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int *in_stack_00000020;
  int end;
  int start;
  int axis_1;
  int i_1;
  int axis;
  int i;
  int num_axis;
  int _axes [4];
  int *axes_ptr;
  int *ends_ptr;
  int *starts_ptr;
  bool numpy_style_slice;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  int local_118;
  int local_114;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int iVar3;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  byte local_bd;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78 [6];
  int *local_60;
  int *local_58;
  int *local_50;
  byte local_45;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int *local_30;
  int *local_28;
  int *local_20;
  int *local_18;
  
  local_34 = *(int *)(in_RSI + 0x2c);
  local_38 = *(int *)(in_RSI + 0x30);
  local_3c = *(int *)(in_RSI + 0x34);
  local_40 = *(int *)(in_RSI + 0x38);
  local_44 = *(int *)(in_RSI + 0x28);
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  local_bd = 0;
  if (!bVar1) {
    bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    local_bd = bVar1 ^ 0xff;
  }
  local_45 = local_bd & 1;
  if (local_45 == 0) {
    *local_18 = *(int *)(in_RDI + 0xd0);
    *local_20 = *(int *)(in_RDI + 0xd4);
    *local_28 = *(int *)(in_RDI + 0xd8);
    *local_30 = *(int *)(in_RDI + 0xdc);
    *in_stack_00000008 = local_34;
    *in_stack_00000010 = local_38;
    *in_stack_00000018 = local_3c;
    *in_stack_00000020 = local_40;
    if ((local_44 == 1) &&
       (*in_stack_00000008 = (local_34 - *(int *)(in_RDI + 0xd0)) - *(int *)(in_RDI + 0xf0),
       *(int *)(in_RDI + 0xe0) != -0xe9)) {
      piVar2 = std::min<int>((int *)(in_RDI + 0xe0),in_stack_00000008);
      *in_stack_00000008 = *piVar2;
    }
    if (local_44 == 2) {
      *in_stack_00000008 = (local_34 - *(int *)(in_RDI + 0xd0)) - *(int *)(in_RDI + 0xf0);
      if (*(int *)(in_RDI + 0xe0) != -0xe9) {
        piVar2 = std::min<int>((int *)(in_RDI + 0xe0),in_stack_00000008);
        *in_stack_00000008 = *piVar2;
      }
      *in_stack_00000010 = (local_38 - *(int *)(in_RDI + 0xd4)) - *(int *)(in_RDI + 0xf4);
      if (*(int *)(in_RDI + 0xe4) != -0xe9) {
        piVar2 = std::min<int>((int *)(in_RDI + 0xe4),in_stack_00000010);
        *in_stack_00000010 = *piVar2;
      }
    }
    if (local_44 == 3) {
      *in_stack_00000008 = (local_34 - *(int *)(in_RDI + 0xd0)) - *(int *)(in_RDI + 0xf0);
      if (*(int *)(in_RDI + 0xe0) != -0xe9) {
        piVar2 = std::min<int>((int *)(in_RDI + 0xe0),in_stack_00000008);
        *in_stack_00000008 = *piVar2;
      }
      *in_stack_00000010 = (local_38 - *(int *)(in_RDI + 0xd4)) - *(int *)(in_RDI + 0xf4);
      if (*(int *)(in_RDI + 0xe4) != -0xe9) {
        piVar2 = std::min<int>((int *)(in_RDI + 0xe4),in_stack_00000010);
        *in_stack_00000010 = *piVar2;
      }
      *in_stack_00000020 = (local_40 - *(int *)(in_RDI + 0xdc)) - *(int *)(in_RDI + 0xfc);
      if (*(int *)(in_RDI + 0xec) != -0xe9) {
        piVar2 = std::min<int>((int *)(in_RDI + 0xec),in_stack_00000020);
        *in_stack_00000020 = *piVar2;
      }
    }
    if (local_44 == 4) {
      *in_stack_00000008 = (local_34 - *(int *)(in_RDI + 0xd0)) - *(int *)(in_RDI + 0xf0);
      if (*(int *)(in_RDI + 0xe0) != -0xe9) {
        piVar2 = std::min<int>((int *)(in_RDI + 0xe0),in_stack_00000008);
        *in_stack_00000008 = *piVar2;
      }
      *in_stack_00000010 = (local_38 - *(int *)(in_RDI + 0xd4)) - *(int *)(in_RDI + 0xf4);
      if (*(int *)(in_RDI + 0xe4) != -0xe9) {
        piVar2 = std::min<int>((int *)(in_RDI + 0xe4),in_stack_00000010);
        *in_stack_00000010 = *piVar2;
      }
      *in_stack_00000018 = (local_3c - *(int *)(in_RDI + 0xd8)) - *(int *)(in_RDI + 0xf8);
      if (*(int *)(in_RDI + 0xe8) != -0xe9) {
        piVar2 = std::min<int>((int *)(in_RDI + 0xe8),in_stack_00000018);
        *in_stack_00000018 = *piVar2;
      }
      *in_stack_00000020 = (local_40 - *(int *)(in_RDI + 0xdc)) - *(int *)(in_RDI + 0xfc);
      if (*(int *)(in_RDI + 0xec) != -0xe9) {
        piVar2 = std::min<int>((int *)(in_RDI + 0xec),in_stack_00000020);
        *in_stack_00000020 = *piVar2;
      }
    }
  }
  else {
    *local_18 = 0;
    *local_20 = 0;
    *local_28 = 0;
    *local_30 = 0;
    *in_stack_00000008 = local_34;
    *in_stack_00000010 = local_38;
    *in_stack_00000018 = local_3c;
    *in_stack_00000020 = local_40;
    local_50 = Mat::operator_cast_to_int_((Mat *)(in_RDI + 0x100));
    local_58 = Mat::operator_cast_to_int_((Mat *)(in_RDI + 0x148));
    local_60 = Mat::operator_cast_to_int_((Mat *)(in_RDI + 400));
    local_78[0] = 0;
    local_78[1] = 1;
    local_78[2] = 2;
    local_78[3] = 3;
    local_7c = *(int *)(in_RDI + 0x1bc);
    if (local_7c == 0) {
      local_7c = local_44;
    }
    else {
      for (local_80 = 0; local_80 < local_7c; local_80 = local_80 + 1) {
        local_84 = local_60[local_80];
        if (local_84 < 0) {
          local_84 = local_44 + local_84;
        }
        local_78[local_80] = local_84;
      }
    }
    for (local_88 = 0; local_88 < local_7c; local_88 = local_88 + 1) {
      local_8c = local_78[local_88];
      local_90 = local_50[local_88];
      local_94 = local_58[local_88];
      if (local_44 == 1) {
        if (local_90 == -0xe9) {
          local_90 = 0;
        }
        if (local_94 == -0xe9) {
          local_94 = local_34;
        }
        if (local_90 < 0) {
          local_cc = local_34 + local_90;
        }
        else {
          local_cc = local_90;
        }
        *local_18 = local_cc;
        if (local_94 < 1) {
          local_d0 = local_34 + local_94;
        }
        else {
          local_d0 = local_94;
        }
        local_98 = local_d0;
        piVar2 = std::min<int>(&local_34,&local_98);
        *in_stack_00000008 = *piVar2 - *local_18;
      }
      if (local_44 == 2) {
        if (local_8c == 0) {
          if (local_90 == -0xe9) {
            local_90 = 0;
          }
          if (local_94 == -0xe9) {
            local_94 = local_38;
          }
          if (local_90 < 0) {
            local_d4 = local_38 + local_90;
          }
          else {
            local_d4 = local_90;
          }
          *local_20 = local_d4;
          if (local_94 < 1) {
            local_d8 = local_38 + local_94;
          }
          else {
            local_d8 = local_94;
          }
          local_9c = local_d8;
          piVar2 = std::min<int>(&local_38,&local_9c);
          *in_stack_00000010 = *piVar2 - *local_20;
        }
        if (local_8c == 1) {
          if (local_90 == -0xe9) {
            local_90 = 0;
          }
          if (local_94 == -0xe9) {
            local_94 = local_34;
          }
          if (local_90 < 0) {
            local_dc = local_34 + local_90;
          }
          else {
            local_dc = local_90;
          }
          *local_18 = local_dc;
          if (local_94 < 1) {
            local_e0 = local_34 + local_94;
          }
          else {
            local_e0 = local_94;
          }
          local_a0 = local_e0;
          piVar2 = std::min<int>(&local_34,&local_a0);
          *in_stack_00000008 = *piVar2 - *local_18;
        }
      }
      if (local_44 == 3) {
        if (local_8c == 0) {
          if (local_90 == -0xe9) {
            local_90 = 0;
          }
          if (local_94 == -0xe9) {
            local_94 = local_40;
          }
          if (local_90 < 0) {
            local_e4 = local_40 + local_90;
          }
          else {
            local_e4 = local_90;
          }
          *local_30 = local_e4;
          if (local_94 < 1) {
            local_e8 = local_40 + local_94;
          }
          else {
            local_e8 = local_94;
          }
          local_a4 = local_e8;
          piVar2 = std::min<int>(&local_40,&local_a4);
          *in_stack_00000020 = *piVar2 - *local_30;
        }
        if (local_8c == 1) {
          if (local_90 == -0xe9) {
            local_90 = 0;
          }
          if (local_94 == -0xe9) {
            local_94 = local_38;
          }
          if (local_90 < 0) {
            local_ec = local_38 + local_90;
          }
          else {
            local_ec = local_90;
          }
          *local_20 = local_ec;
          if (local_94 < 1) {
            local_f0 = local_38 + local_94;
          }
          else {
            local_f0 = local_94;
          }
          local_a8 = local_f0;
          piVar2 = std::min<int>(&local_38,&local_a8);
          *in_stack_00000010 = *piVar2 - *local_20;
        }
        if (local_8c == 2) {
          if (local_90 == -0xe9) {
            local_90 = 0;
          }
          if (local_94 == -0xe9) {
            local_94 = local_34;
          }
          if (local_90 < 0) {
            local_f4 = local_34 + local_90;
          }
          else {
            local_f4 = local_90;
          }
          *local_18 = local_f4;
          if (local_94 < 1) {
            local_f8 = local_34 + local_94;
          }
          else {
            local_f8 = local_94;
          }
          local_ac = local_f8;
          piVar2 = std::min<int>(&local_34,&local_ac);
          *in_stack_00000008 = *piVar2 - *local_18;
        }
      }
      if (local_44 == 4) {
        if (local_8c == 0) {
          if (local_90 == -0xe9) {
            local_90 = 0;
          }
          if (local_94 == -0xe9) {
            local_94 = local_40;
          }
          if (local_90 < 0) {
            local_fc = local_40 + local_90;
          }
          else {
            local_fc = local_90;
          }
          *local_30 = local_fc;
          if (local_94 < 1) {
            local_100 = local_40 + local_94;
          }
          else {
            local_100 = local_94;
          }
          local_b0 = local_100;
          piVar2 = std::min<int>(&local_40,&local_b0);
          *in_stack_00000020 = *piVar2 - *local_30;
        }
        if (local_8c == 1) {
          if (local_90 == -0xe9) {
            local_90 = 0;
          }
          if (local_94 == -0xe9) {
            local_94 = local_3c;
          }
          if (local_90 < 0) {
            local_104 = local_3c + local_90;
          }
          else {
            local_104 = local_90;
          }
          *local_28 = local_104;
          if (local_94 < 1) {
            local_108 = local_3c + local_94;
          }
          else {
            local_108 = local_94;
          }
          local_b4 = local_108;
          piVar2 = std::min<int>(&local_3c,&local_b4);
          *in_stack_00000018 = *piVar2 - *local_28;
        }
        if (local_8c == 2) {
          if (local_90 == -0xe9) {
            local_90 = 0;
          }
          if (local_94 == -0xe9) {
            local_94 = local_38;
          }
          iVar3 = local_90;
          if (local_90 < 0) {
            iVar3 = local_38 + local_90;
          }
          *local_20 = iVar3;
          local_b8 = local_94;
          if (local_94 < 1) {
            local_b8 = local_38 + local_94;
          }
          piVar2 = std::min<int>(&local_38,&local_b8);
          *in_stack_00000010 = *piVar2 - *local_20;
        }
        if (local_8c == 3) {
          if (local_90 == -0xe9) {
            local_90 = 0;
          }
          if (local_94 == -0xe9) {
            local_94 = local_34;
          }
          if (local_90 < 0) {
            local_114 = local_34 + local_90;
          }
          else {
            local_114 = local_90;
          }
          *local_18 = local_114;
          if (local_94 < 1) {
            local_118 = local_34 + local_94;
          }
          else {
            local_118 = local_94;
          }
          local_bc = local_118;
          piVar2 = std::min<int>(&local_34,&local_bc);
          *in_stack_00000008 = *piVar2 - *local_18;
        }
      }
    }
  }
  return;
}

Assistant:

void Crop::resolve_crop_roi(const Mat& bottom_blob, int& _woffset, int& _hoffset, int& _doffset, int& _coffset, int& _outw, int& _outh, int& _outd, int& _outc) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool numpy_style_slice = !starts.empty() && !ends.empty();
    if (numpy_style_slice)
    {
        _woffset = 0;
        _hoffset = 0;
        _doffset = 0;
        _coffset = 0;
        _outw = w;
        _outh = h;
        _outd = d;
        _outc = channels;

        const int* starts_ptr = starts;
        const int* ends_ptr = ends;
        const int* axes_ptr = axes;

        int _axes[4] = {0, 1, 2, 3};
        int num_axis = axes.w;
        if (num_axis == 0)
        {
            num_axis = dims;
        }
        else
        {
            for (int i = 0; i < num_axis; i++)
            {
                int axis = axes_ptr[i];
                if (axis < 0)
                    axis = dims + axis;
                _axes[i] = axis;
            }
        }

        for (int i = 0; i < num_axis; i++)
        {
            int axis = _axes[i];
            int start = starts_ptr[i];
            int end = ends_ptr[i];

            if (dims == 1) // axis == 0
            {
                if (start == -233) start = 0;
                if (end == -233) end = w;
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
            if (dims == 2)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = h;
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = w;
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
            if (dims == 3)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = channels;
                    _coffset = start >= 0 ? start : channels + start;
                    _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = h;
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
                }
                if (axis == 2)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = w;
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
            if (dims == 4)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = channels;
                    _coffset = start >= 0 ? start : channels + start;
                    _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = d;
                    _doffset = start >= 0 ? start : d + start;
                    _outd = std::min(d, end > 0 ? end : d + end) - _doffset;
                }
                if (axis == 2)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = h;
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
                }
                if (axis == 3)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = w;
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
        }
    }
    else
    {
        _woffset = woffset;
        _hoffset = hoffset;
        _doffset = doffset;
        _coffset = coffset;
        _outw = w;
        _outh = h;
        _outd = d;
        _outc = channels;

        if (dims == 1)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);
        }
        if (dims == 2)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);

            _outh = h - hoffset - hoffset2;
            if (outh != -233)
                _outh = std::min(outh, _outh);
        }
        if (dims == 3)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);

            _outh = h - hoffset - hoffset2;
            if (outh != -233)
                _outh = std::min(outh, _outh);

            _outc = channels - coffset - coffset2;
            if (outc != -233)
                _outc = std::min(outc, _outc);
        }
        if (dims == 4)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);

            _outh = h - hoffset - hoffset2;
            if (outh != -233)
                _outh = std::min(outh, _outh);

            _outd = d - doffset - doffset2;
            if (outd != -233)
                _outd = std::min(outd, _outd);

            _outc = channels - coffset - coffset2;
            if (outc != -233)
                _outc = std::min(outc, _outc);
        }
    }
}